

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrGetActionStateVector2f
                   (XrSession session,XrActionStateGetInfo *getInfo,XrActionStateVector2f *state)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_34;
  LoaderInstance *pLStack_30;
  XrResult result;
  LoaderInstance *loader_instance;
  XrActionStateVector2f *state_local;
  XrActionStateGetInfo *getInfo_local;
  XrSession session_local;
  
  loader_instance = (LoaderInstance *)state;
  state_local = (XrActionStateVector2f *)getInfo;
  getInfo_local = (XrActionStateGetInfo *)session;
  local_34 = ActiveLoaderInstance::Get(&stack0xffffffffffffffd0,"xrGetActionStateVector2f");
  if (XR_ERROR_VALIDATION_FAILURE < local_34) {
    this = LoaderInstance::DispatchTable(pLStack_30);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_34 = (*pXVar1->GetActionStateVector2f)
                         ((XrSession)getInfo_local,(XrActionStateGetInfo *)state_local,
                          (XrActionStateVector2f *)loader_instance);
  }
  return local_34;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrGetActionStateVector2f(
    XrSession                                   session,
    const XrActionStateGetInfo*                 getInfo,
    XrActionStateVector2f*                      state) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrGetActionStateVector2f");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->GetActionStateVector2f(session, getInfo, state);
    }
    return result;
}